

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ClockingItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingItemSyntax,slang::syntax::ClockingItemSyntax_const&>
          (BumpAllocator *this,ClockingItemSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  ClockingItemSyntax *pCVar8;
  
  pCVar8 = (ClockingItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ClockingItemSyntax *)this->endPtr < pCVar8 + 1) {
    pCVar8 = (ClockingItemSyntax *)allocateSlow(this,0xa0,8);
  }
  else {
    this->head->current = (byte *)(pCVar8 + 1);
  }
  (pCVar8->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pCVar8->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar8->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pCVar8->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f7698;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f75e8;
  (pCVar8->direction).ptr = (args->direction).ptr;
  uVar4 = *(undefined4 *)&(args->decls).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->decls).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar8->decls).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->decls).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar8->decls).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pCVar8->decls).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar8->decls).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->decls).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar8->decls).super_SyntaxListBase.childCount = (args->decls).super_SyntaxListBase.childCount;
  (pCVar8->decls).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f7948;
  sVar2 = (args->decls).elements._M_extent._M_extent_value;
  (pCVar8->decls).elements._M_ptr = (args->decls).elements._M_ptr;
  (pCVar8->decls).elements._M_extent._M_extent_value = sVar2;
  uVar5 = (args->semi).field_0x2;
  NVar6.raw = (args->semi).numFlags.raw;
  uVar7 = (args->semi).rawLen;
  pIVar3 = (args->semi).info;
  (pCVar8->semi).kind = (args->semi).kind;
  (pCVar8->semi).field_0x2 = uVar5;
  (pCVar8->semi).numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar8->semi).rawLen = uVar7;
  (pCVar8->semi).info = pIVar3;
  return pCVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }